

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

void __thiscall
TxRequestTracker::Impl::ReceivedInv
          (Impl *this,NodeId peer,GenTxid *gtxid,bool preferred,microseconds reqtime)

{
  uint256 *__u;
  type *ptVar1;
  size_type *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  weak_ordering wVar10;
  bool bVar11;
  _Head_base<2UL,_unsigned_long,_false> ann;
  mapped_type *pmVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *__t;
  char cVar16;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar17;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *__u_00;
  long in_FS_OFFSET;
  link_info inf;
  link_info inf_1;
  NodeId local_78;
  uint local_70;
  long local_68;
  result_type local_60;
  uint local_48 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __u = &gtxid->m_hash;
  __u_00 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  uVar14 = (__u_00->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.parentcolor_ & 0xfffffffffffffffe;
  local_78 = peer;
joined_r0x00adfffb:
  if (uVar14 != 0) {
    do {
      __t = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)(uVar14 - 0x68);
      bVar11 = *(long *)(uVar14 - 0x40) < peer;
      if (*(long *)(uVar14 - 0x40) == peer) {
        if ((*(ulong *)(uVar14 - 0x38) & 0xe000000000000000) == 0x4000000000000000) {
          wVar10 = _GLOBAL__N_1::std::__detail::_Synth3way::operator()<uint256,_uint256>
                             ((_Synth3way *)&std::__detail::__synth3way,(uint256 *)__t,__u);
          bVar11 = (bool)((byte)wVar10._M_value >> 7);
          goto LAB_00ae0045;
        }
      }
      else {
LAB_00ae0045:
        if (bVar11 == false) goto LAB_00ae0057;
      }
      uVar14 = *(ulong *)(uVar14 + 0x10);
      if (uVar14 == 0) break;
    } while( true );
  }
  goto LAB_00ae01a3;
LAB_00ae0057:
  if (*(long *)(uVar14 - 0x40) == peer) {
    if (((*(ulong *)(uVar14 - 0x38) & 0xe000000000000000) != 0x4000000000000000) ||
       (wVar10 = _GLOBAL__N_1::std::__detail::_Synth3way::operator()<uint256,_uint256>
                           ((_Synth3way *)&std::__detail::__synth3way,__u,(uint256 *)__t),
       -1 < wVar10._M_value)) {
LAB_00ae009c:
      lVar15 = *(long *)(uVar14 + 8);
      goto LAB_00ae00a5;
    }
  }
  else if (*(long *)(uVar14 - 0x40) <= peer) goto LAB_00ae009c;
  uVar14 = *(ulong *)(uVar14 + 8);
  __u_00 = __t;
  goto joined_r0x00adfffb;
LAB_00ae00f5:
  lVar15 = *(long *)(lVar15 + 0x10);
  goto LAB_00ae00a5;
LAB_00ae0148:
  lVar15 = *(long *)(lVar15 + 0x10);
  __u_00 = poVar17;
  goto joined_r0x00ae0105;
LAB_00ae00a5:
  if (lVar15 != 0) {
    do {
      poVar17 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)(lVar15 + -0x68);
      bVar11 = *(long *)(lVar15 + -0x40) < peer;
      if (*(long *)(lVar15 + -0x40) == peer) {
        if ((*(ulong *)(lVar15 + -0x38) & 0xe000000000000000) != 0x4000000000000000)
        goto LAB_00ae00f5;
        wVar10 = _GLOBAL__N_1::std::__detail::_Synth3way::operator()<uint256,_uint256>
                           ((_Synth3way *)&std::__detail::__synth3way,(uint256 *)poVar17,__u);
        bVar11 = (bool)((byte)wVar10._M_value >> 7);
      }
      if (bVar11 != false) goto LAB_00ae00f5;
      lVar15 = *(long *)(lVar15 + 8);
      __t = poVar17;
      if (lVar15 == 0) break;
    } while( true );
  }
  lVar15 = *(long *)(uVar14 + 0x10);
joined_r0x00ae0105:
  poVar17 = __u_00;
  if (lVar15 != 0) {
    do {
      __u_00 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)(lVar15 + -0x68);
      if (*(long *)(lVar15 + -0x40) == peer) {
        if (((*(ulong *)(lVar15 + -0x38) & 0xe000000000000000) != 0x4000000000000000) ||
           (wVar10 = _GLOBAL__N_1::std::__detail::_Synth3way::operator()<uint256,_uint256>
                               ((_Synth3way *)&std::__detail::__synth3way,__u,(uint256 *)__u_00),
           -1 < wVar10._M_value)) goto LAB_00ae0148;
      }
      else if (*(long *)(lVar15 + -0x40) <= peer) goto LAB_00ae0148;
      lVar15 = *(long *)(lVar15 + 8);
      poVar17 = __u_00;
      if (lVar15 == 0) break;
    } while( true );
  }
  if (__t == __u_00) {
LAB_00ae01a3:
    ptVar1 = &(this->m_index).super_type;
    ann._M_head_impl = (unsigned_long)operator_new(0x80);
    uVar3 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 4);
    uVar4 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 8);
    uVar5 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0xc);
    uVar6 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar7 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x14);
    uVar8 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x18);
    uVar9 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x1c);
    uVar14 = this->m_current_sequence;
    *(undefined4 *)ann._M_head_impl = *(undefined4 *)(__u->super_base_blob<256U>).m_data._M_elems;
    *(undefined4 *)(ann._M_head_impl + 4) = uVar3;
    *(undefined4 *)(ann._M_head_impl + 8) = uVar4;
    *(undefined4 *)(ann._M_head_impl + 0xc) = uVar5;
    *(undefined4 *)(ann._M_head_impl + 0x10) = uVar6;
    *(undefined4 *)(ann._M_head_impl + 0x14) = uVar7;
    *(undefined4 *)(ann._M_head_impl + 0x18) = uVar8;
    *(undefined4 *)(ann._M_head_impl + 0x1c) = uVar9;
    ((microseconds *)(ann._M_head_impl + 0x20))->__r = reqtime.__r;
    uVar13 = 0;
    if (preferred) {
      uVar13 = 0x800000000000000;
    }
    *(NodeId *)(ann._M_head_impl + 0x28) = peer;
    *(ulong *)(ann._M_head_impl + 0x30) =
         uVar13 | uVar14 & 0x7ffffffffffffff | (ulong)gtxid->m_is_wtxid << 0x3c;
    local_70 = 0;
    local_60.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_DELAYED;
    local_60.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)
         (_Head_base<2UL,_unsigned_long,_false>)ann._M_head_impl;
    local_60.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = (uint256 *)peer;
    bVar11 = boost::multi_index::detail::
             ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
             ::link_point(&ptVar1->super_type);
    if (bVar11) {
      local_48[0] = 0;
      anon_unknown.dwarf_3e3c455::ByTxHashViewExtractor::operator()
                (&local_60,
                 *(ByTxHashViewExtractor **)&(this->m_index).super_type.super_type.field_0x8,
                 (Announcement *)ann._M_head_impl);
      boost::multi_index::detail::
      ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
      ::link_point((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    *)ptVar1,&local_60,local_48);
      local_60.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<2UL,_unsigned_long,_false>)
             ((ulong)local_60.
                     super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                     .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                     super__Tuple_impl<2UL,_unsigned_long>.
                     super__Head_base<2UL,_unsigned_long,_false>._M_head_impl & 0xffffffff00000000);
      uVar14 = *(ulong *)(ann._M_head_impl + 0x30) >> 0x3d;
      cVar16 = (uVar14 - 1 < 2) + '\x01';
      if ((*(ulong *)(ann._M_head_impl + 0x30) & 0xe000000000000000) == 0x6000000000000000) {
        cVar16 = '\0';
      }
      if (uVar14 == 0) {
        cVar16 = '\0';
      }
      boost::multi_index::detail::
      ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
      ::link_point((ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    *)(this->m_index).
                      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      .member,cVar16,((microseconds *)(ann._M_head_impl + 0x20))->__r,&local_60);
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::link((char *)(ann._M_head_impl + 0x38),
             (char *)((ulong)local_60.
                             super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                             .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                             super__Tuple_impl<2UL,_unsigned_long>.
                             super__Head_base<2UL,_unsigned_long,_false>._M_head_impl & 0xffffffff))
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::link((char *)(ann._M_head_impl + 0x50),(char *)(ulong)local_48[0]);
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::link((char *)(ann._M_head_impl + 0x68),(char *)(ulong)local_70);
    }
    else if (local_68 == 0 || (Announcement *)(local_68 + -0x68) != (Announcement *)ann._M_head_impl
            ) {
      operator_delete((void *)ann._M_head_impl,0x80);
      goto LAB_00ae033c;
    }
    psVar2 = &(this->m_index).node_count;
    *psVar2 = *psVar2 + 1;
    pmVar12 = std::
              unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
              ::operator[](&this->m_peerinfo,&local_78);
    pmVar12->m_total = pmVar12->m_total + 1;
    this->m_current_sequence = this->m_current_sequence + 1;
  }
  else {
    do {
      local_60.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
      super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<2UL,_unsigned_long,_false>)
             &__t->
              super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_60);
      __t = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)((long)local_60.
                      super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                      .super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
                      super__Tuple_impl<2UL,_unsigned_long>.
                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl + -0x68);
      if (local_60.
          super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
          super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
          super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
          _M_head_impl == 0) {
        __t = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
      }
    } while (__t != __u_00);
  }
LAB_00ae033c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool preferred,
        std::chrono::microseconds reqtime)
    {
        // Bail out if we already have a CANDIDATE_BEST announcement for this (txhash, peer) combination. The case
        // where there is a non-CANDIDATE_BEST announcement already will be caught by the uniqueness property of the
        // ByPeer index when we try to emplace the new object below.
        if (m_index.get<ByPeer>().count(ByPeerView{peer, true, gtxid.GetHash()})) return;

        // Try creating the announcement with CANDIDATE_DELAYED state (which will fail due to the uniqueness
        // of the ByPeer index if a non-CANDIDATE_BEST announcement already exists with the same txhash and peer).
        // Bail out in that case.
        auto ret = m_index.get<ByPeer>().emplace(gtxid, peer, preferred, reqtime, m_current_sequence);
        if (!ret.second) return;

        // Update accounting metadata.
        ++m_peerinfo[peer].m_total;
        ++m_current_sequence;
    }